

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O0

RangeList * __thiscall
SoapySDR::Device::getSampleRateRange(Device *this,int direction,size_t channel)

{
  bool bVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  RangeList *in_RDI;
  double *bw;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  RangeList *ranges;
  value_type *in_stack_ffffffffffffff58;
  RangeList *this_00;
  Range local_88;
  reference local_70;
  double *local_68;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_60 [3];
  undefined1 local_48 [24];
  undefined1 *local_30;
  undefined1 local_21;
  undefined8 local_20;
  undefined4 local_14;
  
  local_21 = 0;
  this_00 = in_RDI;
  local_20 = in_RCX;
  local_14 = in_EDX;
  std::vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::vector
            ((vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> *)0x164bbd);
  (*(code *)(in_RSI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[0x3e])(local_48,in_RSI,local_14,local_20);
  local_30 = local_48;
  local_60[0]._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff58);
  local_68 = (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)this_00,
                            (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)in_stack_ffffffffffffff58), bVar1) {
    local_70 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(local_60);
    Range::Range(&local_88,*local_70,*local_70,0.0);
    std::vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::push_back
              (this_00,in_stack_ffffffffffffff58);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(local_60);
  }
  std::vector<double,_std::allocator<double>_>::~vector(in_RSI);
  return in_RDI;
}

Assistant:

SoapySDR::RangeList SoapySDR::Device::getSampleRateRange(const int direction, const size_t channel) const
{
    SoapySDR::RangeList ranges;
    //call into the older deprecated listSampleRates() call
    for (auto &bw : this->listSampleRates(direction, channel))
    {
        ranges.push_back(SoapySDR::Range(bw, bw));
    }
    return ranges;
}